

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int start_page(vorb *f)

{
  int iVar1;
  vorb *in_RDI;
  vorb *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = capture_pattern(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    iVar1 = error(in_RDI,VORBIS_missing_capture_pattern);
  }
  else {
    iVar1 = start_page_no_capturepattern
                      ((vorb *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar1;
}

Assistant:

static int start_page(vorb *f)
{
   if (!capture_pattern(f)) return error(f, VORBIS_missing_capture_pattern);
   return start_page_no_capturepattern(f);
}